

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIEditBox::processKey(CGUIEditBox *this,SEvent *event)

{
  long lVar1;
  bool bVar2;
  u32 uVar3;
  s32 sVar4;
  char *pcVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  u32 *puVar8;
  int *piVar9;
  uint *puVar10;
  long in_RSI;
  long *in_RDI;
  s32 realmend_3;
  s32 realmbgn_3;
  stringw s_4;
  s32 cp_1;
  s32 mb_1;
  s32 lineNo_1;
  s32 cp;
  s32 mb;
  s32 lineNo;
  s32 p_2;
  s32 p_1;
  stringw s_3;
  stringw s_2;
  stringw widep;
  c8 *p;
  s32 realmend_2;
  s32 realmbgn_2;
  stringw s_1;
  stringc sc;
  s32 realmend_1;
  s32 realmbgn_1;
  stringc s;
  s32 realmend;
  s32 realmbgn;
  s32 newMarkEnd;
  s32 newMarkBegin;
  bool textChanged;
  undefined4 in_stack_fffffffffffffc88;
  u32 in_stack_fffffffffffffc8c;
  array<int> *in_stack_fffffffffffffc90;
  string<wchar_t> *this_00;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 uVar11;
  wchar_t *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  wchar_t in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  EGUI_EVENT_TYPE in_stack_fffffffffffffccc;
  EGUI_EVENT_TYPE in_stack_fffffffffffffcd0;
  u32 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  int iVar12;
  undefined4 in_stack_fffffffffffffcdc;
  EGUI_EVENT_TYPE local_320;
  ulong in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  undefined4 local_2e8;
  int local_2e4;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  stringw *in_stack_fffffffffffffd30;
  long *plVar13;
  undefined4 local_2c8;
  undefined4 local_2c4;
  CGUIEditBox *in_stack_fffffffffffffd40;
  undefined4 local_2b8;
  undefined4 local_2b4;
  CGUIEditBox *in_stack_fffffffffffffd60;
  CGUIEditBox *in_stack_fffffffffffffd68;
  u32 local_1f8;
  uint local_1f4;
  int local_1f0;
  EGUI_EVENT_TYPE local_1ec;
  s32 local_1e8;
  u32 local_1e4;
  uint local_1e0;
  int local_1dc;
  EGUI_EVENT_TYPE local_1d8;
  s32 local_1d4;
  u32 local_1d0;
  u32 local_1cc;
  long local_128;
  undefined4 local_120;
  int local_11c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_2c;
  undefined4 local_28;
  u32 local_24;
  EGUI_EVENT_TYPE local_20;
  byte local_19;
  long local_18;
  bool local_1;
  
  if ((*(byte *)(in_RSI + 0x14) & 1) == 0) {
    return false;
  }
  local_19 = 0;
  local_20 = *(EGUI_EVENT_TYPE *)((long)in_RDI + 0x13c);
  local_24 = *(u32 *)(in_RDI + 0x28);
  if ((*(byte *)(in_RSI + 0x14) >> 2 & 1) != 0) {
    if (*(int *)(in_RSI + 8) == 0x5c) {
      inputChar((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                in_stack_fffffffffffffcac);
      return true;
    }
    switch(*(undefined4 *)(in_RSI + 0xc)) {
    case 0x23:
      if ((*(byte *)(in_RSI + 0x14) >> 1 & 1) == 0) {
        uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6c80);
        *(u32 *)(in_RDI + 0x31) = uVar3;
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        local_20 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
        local_24 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6c4f);
        *(undefined4 *)(in_RDI + 0x31) = 0;
      }
      break;
    case 0x24:
      if ((*(byte *)(in_RSI + 0x14) >> 1 & 1) == 0) {
        *(undefined4 *)(in_RDI + 0x31) = 0;
        local_24 = 0;
      }
      else {
        local_24 = *(u32 *)(in_RDI + 0x31);
        *(undefined4 *)(in_RDI + 0x31) = 0;
      }
      local_20 = EGET_ELEMENT_FOCUS_LOST;
      break;
    default:
      return false;
    case 0x41:
      local_20 = EGET_ELEMENT_FOCUS_LOST;
      local_24 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6332);
      break;
    case 0x43:
      if ((((*(byte *)((long)in_RDI + 0x19b) & 1) == 0) && (in_RDI[0x2b] != 0)) &&
         (*(int *)((long)in_RDI + 0x13c) != (int)in_RDI[0x28])) {
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2b4 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        else {
          local_2b4 = (undefined4)in_RDI[0x28];
        }
        local_28 = local_2b4;
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2b8 = (undefined4)in_RDI[0x28];
        }
        else {
          local_2b8 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        local_2c = local_2b8;
        core::string<char>::string((string<char> *)0x3a6430);
        core::string<wchar_t>::subString
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                   SUB41(in_stack_fffffffffffffccc >> 0x18,0));
        core::wStringToUTF8((stringc *)in_stack_fffffffffffffc90,
                            (stringw *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                           );
        core::string<wchar_t>::~string((string<wchar_t> *)0x3a6486);
        in_stack_fffffffffffffd40 = (CGUIEditBox *)in_RDI[0x2b];
        pcVar5 = core::string<char>::c_str((string<char> *)0x3a64aa);
        (**(code **)(*(long *)in_stack_fffffffffffffd40 + 8))(in_stack_fffffffffffffd40,pcVar5);
        core::string<char>::~string((string<char> *)0x3a64c8);
      }
      break;
    case 0x56:
      uVar6 = (**(code **)(*in_RDI + 0x90))();
      if (((uVar6 & 1) != 0) && (in_RDI[0x2b] != 0)) {
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2e4 = *(int *)((long)in_RDI + 0x13c);
        }
        else {
          local_2e4 = (int)in_RDI[0x28];
        }
        local_11c = local_2e4;
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2e8 = (undefined4)in_RDI[0x28];
        }
        else {
          local_2e8 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        local_120 = local_2e8;
        local_128 = (**(code **)(*(long *)in_RDI[0x2b] + 0x18))();
        if (local_128 != 0) {
          core::string<wchar_t>::string((string<wchar_t> *)0x3a68b0);
          core::utf8ToWString(in_stack_fffffffffffffd30,
                              (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
          ;
          bVar2 = SUB41(in_stack_fffffffffffffccc >> 0x18,0);
          if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,bVar2);
            core::string<wchar_t>::append
                      ((string<wchar_t> *)in_stack_fffffffffffffc90,
                       (string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            core::string<wchar_t>::size((string<wchar_t> *)0x3a6951);
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                       SUB41(in_stack_fffffffffffffccc >> 0x18,0));
            core::string<wchar_t>::append
                      ((string<wchar_t> *)in_stack_fffffffffffffc90,
                       (string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            core::string<wchar_t>::~string((string<wchar_t> *)0x3a69a2);
            if ((*(int *)((long)in_RDI + 0x194) == 0) ||
               (uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a69c0),
               uVar3 <= *(uint *)((long)in_RDI + 0x194))) {
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (string<wchar_t> *)in_stack_fffffffffffffc90);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (string<wchar_t> *)in_stack_fffffffffffffc90);
              uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6a0e);
              *(u32 *)(in_RDI + 0x31) = uVar3 + (int)in_RDI[0x31];
            }
            core::string<wchar_t>::~string((string<wchar_t> *)0x3a6a31);
          }
          else {
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,bVar2);
            core::string<wchar_t>::append
                      ((string<wchar_t> *)in_stack_fffffffffffffc90,
                       (string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            core::string<wchar_t>::size((string<wchar_t> *)0x3a6aa1);
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                       SUB41(in_stack_fffffffffffffccc >> 0x18,0));
            core::string<wchar_t>::append
                      ((string<wchar_t> *)in_stack_fffffffffffffc90,
                       (string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            core::string<wchar_t>::~string((string<wchar_t> *)0x3a6ae5);
            if ((*(int *)((long)in_RDI + 0x194) == 0) ||
               (uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6b03),
               uVar3 <= *(uint *)((long)in_RDI + 0x194))) {
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (string<wchar_t> *)in_stack_fffffffffffffc90);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (string<wchar_t> *)in_stack_fffffffffffffc90);
              in_stack_fffffffffffffcf4 = local_11c;
              uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a6b5c);
              *(u32 *)(in_RDI + 0x31) = in_stack_fffffffffffffcf4 + uVar3;
            }
            core::string<wchar_t>::~string((string<wchar_t> *)0x3a6b7f);
          }
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a6b8c);
        }
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
        local_19 = 1;
      }
      break;
    case 0x58:
      if ((((*(byte *)((long)in_RDI + 0x19b) & 1) == 0) && (in_RDI[0x2b] != 0)) &&
         (*(int *)((long)in_RDI + 0x13c) != (int)in_RDI[0x28])) {
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2c4 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        else {
          local_2c4 = (undefined4)in_RDI[0x28];
        }
        local_74 = local_2c4;
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          local_2c8 = (undefined4)in_RDI[0x28];
        }
        else {
          local_2c8 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        local_78 = local_2c8;
        core::string<char>::string((string<char> *)0x3a65bf);
        core::string<wchar_t>::subString
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                   SUB41(in_stack_fffffffffffffccc >> 0x18,0));
        core::wStringToUTF8((stringc *)in_stack_fffffffffffffc90,
                            (stringw *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                           );
        core::string<wchar_t>::~string((string<wchar_t> *)0x3a6615);
        plVar13 = (long *)in_RDI[0x2b];
        pcVar5 = core::string<char>::c_str((string<char> *)0x3a6639);
        (**(code **)(*plVar13 + 8))(plVar13,pcVar5);
        uVar6 = (**(code **)(*in_RDI + 0x90))();
        if ((uVar6 & 1) != 0) {
          core::string<wchar_t>::string((string<wchar_t> *)0x3a6671);
          core::string<wchar_t>::subString
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                     SUB41(in_stack_fffffffffffffccc >> 0x18,0));
          core::string<wchar_t>::operator=
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                     (string<wchar_t> *)in_stack_fffffffffffffc90);
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a66bc);
          core::string<wchar_t>::size((string<wchar_t> *)0x3a66ef);
          core::string<wchar_t>::subString
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                     SUB41(in_stack_fffffffffffffccc >> 0x18,0));
          core::string<wchar_t>::append
                    ((string<wchar_t> *)in_stack_fffffffffffffc90,
                     (string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a6739);
          core::string<wchar_t>::operator=
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                     (string<wchar_t> *)in_stack_fffffffffffffc90);
          *(undefined4 *)(in_RDI + 0x31) = local_74;
          local_20 = EGET_ELEMENT_FOCUS_LOST;
          local_24 = 0;
          local_19 = 1;
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a6795);
        }
        core::string<char>::~string((string<char> *)0x3a67a2);
      }
    }
    goto LAB_003a7bb1;
  }
  if (*(int *)(in_RSI + 8) == 0) {
    in_stack_fffffffffffffce8 = (ulong)(*(int *)(in_RSI + 0xc) - 0x23);
    local_18 = in_RSI;
    switch(in_stack_fffffffffffffce8) {
    case 0:
      local_1cc = core::string<wchar_t>::size((string<wchar_t> *)0x3a6d13);
      if (((*(byte *)(in_RDI + 0x33) & 1) != 0) || ((*(byte *)((long)in_RDI + 0x199) & 1) != 0)) {
        local_1cc = getLineFromPos((CGUIEditBox *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                   (s32)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        iVar12 = *piVar9;
        core::array<irr::core::string<wchar_t>_>::operator[]
                  ((array<irr::core::string<wchar_t>_> *)in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc8c);
        local_1cc = core::string<wchar_t>::size((string<wchar_t> *)0x3a6da0);
        local_1cc = iVar12 + local_1cc;
        if ((0 < (int)local_1cc) &&
           ((pwVar7 = core::string<wchar_t>::operator[]
                                ((string<wchar_t> *)in_stack_fffffffffffffc90,
                                 in_stack_fffffffffffffc8c), *pwVar7 == L'\r' ||
            (pwVar7 = core::string<wchar_t>::operator[]
                                ((string<wchar_t> *)in_stack_fffffffffffffc90,
                                 in_stack_fffffffffffffc8c), *pwVar7 == L'\n')))) {
          local_1cc = local_1cc - 1;
        }
      }
      if ((*(byte *)(local_18 + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
          local_20 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
        }
        local_24 = local_1cc;
      }
      *(u32 *)(in_RDI + 0x31) = local_1cc;
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      break;
    case 1:
      local_1d0 = 0;
      if (((*(byte *)(in_RDI + 0x33) & 1) != 0) || ((*(byte *)((long)in_RDI + 0x199) & 1) != 0)) {
        local_1d0 = getLineFromPos((CGUIEditBox *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                   (s32)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        puVar8 = (u32 *)core::array<int>::operator[]
                                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        local_1d0 = *puVar8;
      }
      if ((*(byte *)(local_18 + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
          local_20 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
        }
        local_24 = local_1d0;
      }
      *(u32 *)(in_RDI + 0x31) = local_1d0;
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      break;
    case 2:
      if ((*(byte *)(in_RSI + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else if (0 < (int)in_RDI[0x31]) {
        if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
          local_20 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
        }
        local_24 = (int)in_RDI[0x31] - 1;
      }
      if (0 < (int)in_RDI[0x31]) {
        *(int *)(in_RDI + 0x31) = (int)in_RDI[0x31] + -1;
      }
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      break;
    case 3:
      if (((*(byte *)((long)in_RDI + 0x199) & 1) == 0) &&
         (((*(byte *)(in_RDI + 0x33) & 1) == 0 ||
          (uVar3 = core::array<irr::core::string<wchar_t>_>::size
                             ((array<irr::core::string<wchar_t>_> *)0x3a7185), uVar3 < 2)))) {
        return false;
      }
      local_1d4 = getLineFromPos((CGUIEditBox *)
                                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                 (s32)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
        local_320 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
      }
      else if ((int)in_RDI[0x28] < *(int *)((long)in_RDI + 0x13c)) {
        local_320 = *(EGUI_EVENT_TYPE *)((long)in_RDI + 0x13c);
      }
      else {
        local_320 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x28);
      }
      local_1d8 = local_320;
      if (0 < local_1d4) {
        iVar12 = (int)in_RDI[0x31];
        piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        local_1dc = iVar12 - *piVar9;
        core::array<irr::core::string<wchar_t>_>::operator[]
                  ((array<irr::core::string<wchar_t>_> *)in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc8c);
        uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a728a);
        if ((int)uVar3 < local_1dc) {
          puVar8 = (u32 *)core::array<int>::operator[]
                                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
          in_stack_fffffffffffffcd4 = *puVar8;
          local_1e0 = 1;
          core::array<irr::core::string<wchar_t>_>::operator[]
                    ((array<irr::core::string<wchar_t>_> *)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c);
          local_1e4 = core::string<wchar_t>::size((string<wchar_t> *)0x3a72ec);
          puVar10 = core::max_<unsigned_int>(&local_1e0,&local_1e4);
          *(u32 *)(in_RDI + 0x31) = in_stack_fffffffffffffcd4 + *puVar10 + -1;
        }
        else {
          piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c)
          ;
          *(int *)(in_RDI + 0x31) = *piVar9 + local_1dc;
        }
      }
      if ((*(byte *)(local_18 + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        local_20 = local_1d8;
        local_24 = *(u32 *)(in_RDI + 0x31);
      }
      break;
    case 4:
      if ((*(byte *)(in_RSI + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a708b);
        if (*(uint *)(in_RDI + 0x31) < uVar3) {
          if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
            local_20 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
          }
          local_24 = (int)in_RDI[0x31] + 1;
        }
      }
      uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a710a);
      if (*(uint *)(in_RDI + 0x31) < uVar3) {
        *(int *)(in_RDI + 0x31) = (int)in_RDI[0x31] + 1;
      }
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      break;
    case 5:
      if (((*(byte *)((long)in_RDI + 0x199) & 1) == 0) &&
         (((*(byte *)(in_RDI + 0x33) & 1) == 0 ||
          (uVar3 = core::array<irr::core::string<wchar_t>_>::size
                             ((array<irr::core::string<wchar_t>_> *)0x3a73fa), uVar3 < 2)))) {
        return false;
      }
      sVar4 = getLineFromPos((CGUIEditBox *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                             (s32)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
        in_stack_fffffffffffffcd0 = *(EGUI_EVENT_TYPE *)(in_RDI + 0x31);
      }
      else if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
        in_stack_fffffffffffffccc = *(EGUI_EVENT_TYPE *)((long)in_RDI + 0x13c);
        in_stack_fffffffffffffcd0 = in_stack_fffffffffffffccc;
      }
      else {
        in_stack_fffffffffffffccc = *(EGUI_EVENT_TYPE *)(in_RDI + 0x28);
        in_stack_fffffffffffffcd0 = in_stack_fffffffffffffccc;
      }
      local_1ec = in_stack_fffffffffffffcd0;
      local_1e8 = sVar4;
      uVar3 = core::array<irr::core::string<wchar_t>_>::size
                        ((array<irr::core::string<wchar_t>_> *)0x3a74b5);
      if (sVar4 < (int)(uVar3 - 1)) {
        lVar1 = in_RDI[0x31];
        piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        local_1f0 = (int)lVar1 - *piVar9;
        core::array<irr::core::string<wchar_t>_>::operator[]
                  ((array<irr::core::string<wchar_t>_> *)in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc8c);
        uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a7521);
        if ((int)uVar3 < local_1f0) {
          piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c)
          ;
          iVar12 = *piVar9;
          local_1f4 = 1;
          core::array<irr::core::string<wchar_t>_>::operator[]
                    ((array<irr::core::string<wchar_t>_> *)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c);
          local_1f8 = core::string<wchar_t>::size((string<wchar_t> *)0x3a7583);
          puVar10 = core::max_<unsigned_int>(&local_1f4,&local_1f8);
          *(uint *)(in_RDI + 0x31) = iVar12 + *puVar10 + -1;
        }
        else {
          piVar9 = core::array<int>::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c)
          ;
          *(int *)(in_RDI + 0x31) = *piVar9 + local_1f0;
        }
      }
      if ((*(byte *)(local_18 + 0x14) >> 1 & 1) == 0) {
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
      }
      else {
        local_20 = local_1ec;
        local_24 = *(u32 *)(in_RDI + 0x31);
      }
      break;
    default:
      return false;
    case 10:
      uVar6 = (**(code **)(*in_RDI + 0x90))();
      if ((uVar6 & 1) != 0) {
        *(byte *)((long)in_RDI + 0x134) = (*(byte *)((long)in_RDI + 0x134) ^ 0xff) & 1;
      }
      break;
    case 0xb:
      uVar6 = (**(code **)(*in_RDI + 0x90))();
      if (((uVar6 & 1) != 0) && (bVar2 = keyDelete(in_stack_fffffffffffffd68), bVar2)) {
        uVar3 = os::Timer::getTime();
        *(u32 *)(in_RDI + 0x2c) = uVar3;
        local_20 = EGET_ELEMENT_FOCUS_LOST;
        local_24 = 0;
        local_19 = 1;
      }
    }
    goto LAB_003a7bb1;
  }
  switch(*(undefined4 *)(in_RSI + 0xc)) {
  case 8:
    uVar6 = (**(code **)(*in_RDI + 0x90))();
    if (((uVar6 & 1) != 0) &&
       (uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a77b0), uVar3 != 0)) {
      core::string<wchar_t>::string((string<wchar_t> *)0x3a77c6);
      bVar2 = SUB41(in_stack_fffffffffffffccc >> 0x18,0);
      if (*(int *)((long)in_RDI + 0x13c) == (int)in_RDI[0x28]) {
        if ((int)in_RDI[0x31] < 1) {
          core::string<wchar_t>::operator=
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     in_stack_fffffffffffffca0);
        }
        else {
          core::string<wchar_t>::subString
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,bVar2);
          core::string<wchar_t>::operator=
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                     (string<wchar_t> *)in_stack_fffffffffffffc90);
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a79c1);
        }
        this_00 = (string<wchar_t> *)(in_RDI + 0x15);
        uVar11 = (undefined4)in_RDI[0x31];
        core::string<wchar_t>::size((string<wchar_t> *)0x3a7a03);
        core::string<wchar_t>::subString
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                   SUB41(in_stack_fffffffffffffccc >> 0x18,0));
        core::string<wchar_t>::append
                  (this_00,(string<wchar_t> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        core::string<wchar_t>::~string((string<wchar_t> *)0x3a7a4e);
        core::string<wchar_t>::operator=
                  ((string<wchar_t> *)CONCAT44(uVar11,in_stack_fffffffffffffc98),this_00);
        *(int *)(in_RDI + 0x31) = (int)in_RDI[0x31] + -1;
      }
      else {
        if (*(int *)((long)in_RDI + 0x13c) < (int)in_RDI[0x28]) {
          uVar11 = *(undefined4 *)((long)in_RDI + 0x13c);
        }
        else {
          uVar11 = (undefined4)in_RDI[0x28];
        }
        core::string<wchar_t>::subString
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,bVar2);
        core::string<wchar_t>::operator=
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   (string<wchar_t> *)in_stack_fffffffffffffc90);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3a78b9);
        core::string<wchar_t>::size((string<wchar_t> *)0x3a78e6);
        core::string<wchar_t>::subString
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                   SUB41(in_stack_fffffffffffffccc >> 0x18,0));
        core::string<wchar_t>::append
                  ((string<wchar_t> *)in_stack_fffffffffffffc90,
                   (string<wchar_t> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
        ;
        core::string<wchar_t>::~string((string<wchar_t> *)0x3a792a);
        core::string<wchar_t>::operator=
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   (string<wchar_t> *)in_stack_fffffffffffffc90);
        *(undefined4 *)(in_RDI + 0x31) = uVar11;
      }
      if ((int)in_RDI[0x31] < 0) {
        *(undefined4 *)(in_RDI + 0x31) = 0;
      }
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      local_20 = EGET_ELEMENT_FOCUS_LOST;
      local_24 = 0;
      local_19 = 1;
      core::string<wchar_t>::~string((string<wchar_t> *)0x3a7ae4);
    }
    goto LAB_003a7bb1;
  case 9:
  case 0x10:
  case 0x1b:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
    local_1 = false;
    break;
  default:
    inputChar((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac);
    local_1 = true;
    break;
  case 0xd:
    if ((*(byte *)((long)in_RDI + 0x199) & 1) == 0) {
      calculateScrollPos(in_stack_fffffffffffffd60);
      sendGuiEvent((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffccc);
    }
    else {
      inputChar((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                in_stack_fffffffffffffcac);
    }
    local_1 = true;
    break;
  case 0x2e:
    if (*(int *)(in_RSI + 8) != 0x7f) {
      inputChar((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                in_stack_fffffffffffffcac);
      return true;
    }
    uVar6 = (**(code **)(*in_RDI + 0x90))();
    if (((uVar6 & 1) != 0) && (bVar2 = keyDelete(in_stack_fffffffffffffd68), bVar2)) {
      uVar3 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x2c) = uVar3;
      local_20 = EGET_ELEMENT_FOCUS_LOST;
      local_24 = 0;
      local_19 = 1;
    }
LAB_003a7bb1:
    setTextMarkers((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (s32)(in_stack_fffffffffffffce8 >> 0x20),(s32)in_stack_fffffffffffffce8);
    if ((local_19 & 1) == 0) {
      calculateScrollPos(in_stack_fffffffffffffd60);
    }
    else {
      breakText(in_stack_fffffffffffffd40);
      calculateScrollPos(in_stack_fffffffffffffd60);
      sendGuiEvent((CGUIEditBox *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffccc);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool CGUIEditBox::processKey(const SEvent &event)
{
	if (!event.KeyInput.PressedDown)
		return false;

	bool textChanged = false;
	s32 newMarkBegin = MarkBegin;
	s32 newMarkEnd = MarkEnd;

	// control shortcut handling

	if (event.KeyInput.Control) {
		// german backlash '\' entered with control + '?'
		if (event.KeyInput.Char == '\\') {
			inputChar(event.KeyInput.Char);
			return true;
		}

		switch (event.KeyInput.Key) {
		case KEY_KEY_A:
			// select all
			newMarkBegin = 0;
			newMarkEnd = Text.size();
			break;
		case KEY_KEY_C:
			// copy to clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				core::stringc s;
				wStringToUTF8(s, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(s.c_str());
			}
			break;
		case KEY_KEY_X:
			// cut to the clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// copy
				core::stringc sc;
				wStringToUTF8(sc, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(sc.c_str());

				if (isEnabled()) {
					// delete
					core::stringw s;
					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
			}
			break;
		case KEY_KEY_V:
			if (!isEnabled())
				break;

			// paste from the clipboard
			if (Operator) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// add the string
				const c8 *p = Operator->getTextFromClipboard();
				if (p) {
					irr::core::stringw widep;
					core::utf8ToWString(widep, p);

					if (MarkBegin == MarkEnd) {
						// insert text
						core::stringw s = Text.subString(0, CursorPos);
						s.append(widep);
						s.append(Text.subString(CursorPos, Text.size() - CursorPos));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos += s.size();
						}
					} else {
						// replace text

						core::stringw s = Text.subString(0, realmbgn);
						s.append(widep);
						s.append(Text.subString(realmend, Text.size() - realmend));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos = realmbgn + s.size();
						}
					}
				}

				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		case KEY_HOME:
			// move/highlight to start of text
			if (event.KeyInput.Shift) {
				newMarkEnd = CursorPos;
				newMarkBegin = 0;
				CursorPos = 0;
			} else {
				CursorPos = 0;
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		case KEY_END:
			// move/highlight to end of text
			if (event.KeyInput.Shift) {
				newMarkBegin = CursorPos;
				newMarkEnd = Text.size();
				CursorPos = 0;
			} else {
				CursorPos = Text.size();
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		default:
			return false;
		}
	}
	// Some special keys - but only handle them if KeyInput.Char is null as on some systems (X11) they might have same key-code as ansi-keys otherwise
	else if (event.KeyInput.Char == 0) {
		switch (event.KeyInput.Key) {
		case KEY_END: {
			s32 p = Text.size();
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p] + (s32)BrokenText[p].size();
				if (p > 0 && (Text[p - 1] == L'\r' || Text[p - 1] == L'\n'))
					p -= 1;
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;

				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_HOME: {

			s32 p = 0;
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p];
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;
				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_LEFT:

			if (event.KeyInput.Shift) {
				if (CursorPos > 0) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos - 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (CursorPos > 0)
				CursorPos--;
			BlinkStartTime = os::Timer::getTime();
			break;

		case KEY_RIGHT:
			if (event.KeyInput.Shift) {
				if (Text.size() > (u32)CursorPos) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos + 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (Text.size() > (u32)CursorPos)
				CursorPos++;
			BlinkStartTime = os::Timer::getTime();
			break;
		case KEY_UP:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin > MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo > 0) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo - 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo - 1] + core::max_((u32)1, BrokenText[lineNo - 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo - 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_DOWN:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin < MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo < (s32)BrokenText.size() - 1) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo + 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo + 1] + core::max_((u32)1, BrokenText[lineNo + 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo + 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_INSERT:
			if (!isEnabled())
				break;

			OverwriteMode = !OverwriteMode;
			break;
		case KEY_DELETE:
			if (!isEnabled())
				break;

			if (keyDelete()) {
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		default:
			return false;
		}
	} else {
		// default keyboard handling
		switch (event.KeyInput.Key) {
		case KEY_RETURN:
			if (MultiLine) {
				inputChar(L'\n');
			} else {
				calculateScrollPos();
				sendGuiEvent(EGET_EDITBOX_ENTER);
			}
			return true;

		case KEY_BACK:
			if (!isEnabled())
				break;

			if (Text.size()) {
				core::stringw s;

				if (MarkBegin != MarkEnd) {
					// delete marked text
					const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
					const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
				} else {
					// delete text behind cursor
					if (CursorPos > 0)
						s = Text.subString(0, CursorPos - 1);
					else
						s = L"";
					s.append(Text.subString(CursorPos, Text.size() - CursorPos));
					Text = s;
					--CursorPos;
				}

				if (CursorPos < 0)
					CursorPos = 0;
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;

		case KEY_DELETE:

			// At least on X11 we get a char with 127 when the delete key is pressed.
			// We get no char when the delete key on numkeys is pressed with numlock off (handled in the other case calling keyDelete as Char is then 0).
			// We get a keykode != 127 when delete key on numlock is pressed with numlock on.
			if (event.KeyInput.Char == 127) {
				if (!isEnabled())
					break;

				if (keyDelete()) {
					BlinkStartTime = os::Timer::getTime();
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
				break;
			} else {
				inputChar(event.KeyInput.Char);
				return true;
			}

		case KEY_ESCAPE:
		case KEY_TAB:
		case KEY_SHIFT:
		case KEY_F1:
		case KEY_F2:
		case KEY_F3:
		case KEY_F4:
		case KEY_F5:
		case KEY_F6:
		case KEY_F7:
		case KEY_F8:
		case KEY_F9:
		case KEY_F10:
		case KEY_F11:
		case KEY_F12:
		case KEY_F13:
		case KEY_F14:
		case KEY_F15:
		case KEY_F16:
		case KEY_F17:
		case KEY_F18:
		case KEY_F19:
		case KEY_F20:
		case KEY_F21:
		case KEY_F22:
		case KEY_F23:
		case KEY_F24:
			// ignore these keys
			return false;

		default:
			inputChar(event.KeyInput.Char);
			return true;
		}
	}

	// Set new text markers
	setTextMarkers(newMarkBegin, newMarkEnd);

	// break the text if it has changed
	if (textChanged) {
		breakText();
		calculateScrollPos();
		sendGuiEvent(EGET_EDITBOX_CHANGED);
	} else {
		calculateScrollPos();
	}

	return true;
}